

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O0

bool __thiscall LowererMD::GenerateFastAdd(LowererMD *this,Instr *instrAdd)

{
  code *pcVar1;
  bool bVar2;
  IRType IVar3;
  int iVar4;
  undefined4 *puVar5;
  RegOpnd *pRVar6;
  AddrOpnd *pAVar7;
  Opnd *src2Opnd;
  Opnd *pOVar8;
  bool local_75;
  bool local_74;
  bool local_73;
  bool local_72;
  bool local_71;
  int value;
  Opnd *opndTmp;
  bool isTaggedInts;
  IntConstOpnd *pIStack_50;
  Opnd *opndSrc2;
  Opnd *opndSrc1;
  Opnd *opndReg;
  LabelInstr *labelFallThru;
  LabelInstr *labelHelper;
  Instr *instr;
  Instr *instrAdd_local;
  LowererMD *this_local;
  
  instr = instrAdd;
  instrAdd_local = (Instr *)this;
  opndSrc2 = IR::Instr::GetSrc1(instrAdd);
  pIStack_50 = (IntConstOpnd *)IR::Instr::GetSrc2(instr);
  if ((opndSrc2 == (Opnd *)0x0) || (pIStack_50 == (IntConstOpnd *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                       ,0xbea,"(opndSrc1 && opndSrc2)","Expected 2 src opnd\'s on Add instruction");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar2 = IR::Opnd::IsRegOpnd(opndSrc2);
  local_71 = false;
  if (bVar2) {
    pRVar6 = IR::Opnd::AsRegOpnd(opndSrc2);
    bVar2 = IR::Opnd::IsNotInt(&pRVar6->super_Opnd);
    local_72 = true;
    if (!bVar2) {
      opndTmp._6_2_ =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           IR::Opnd::GetValueType(opndSrc2);
      bVar2 = ValueType::IsString((ValueType *)((long)&opndTmp + 6));
      local_72 = true;
      if (!bVar2) {
        local_73 = false;
        if (instr->m_opcode != Incr_A) {
          opndTmp._4_2_ =
               (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
               IR::Opnd::GetValueType(opndSrc2);
          local_73 = ValueType::IsLikelyString((ValueType *)((long)&opndTmp + 4));
        }
        local_72 = local_73;
      }
    }
    local_71 = local_72;
  }
  if (local_71 == false) {
    bVar2 = IR::Opnd::IsRegOpnd(&pIStack_50->super_Opnd);
    local_74 = false;
    if (bVar2) {
      pRVar6 = IR::Opnd::AsRegOpnd(&pIStack_50->super_Opnd);
      bVar2 = IR::Opnd::IsNotInt(&pRVar6->super_Opnd);
      local_75 = true;
      if (!bVar2) {
        opndTmp._2_2_ =
             (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
             IR::Opnd::GetValueType(&pIStack_50->super_Opnd);
        local_75 = ValueType::IsLikelyString((ValueType *)((long)&opndTmp + 2));
      }
      local_74 = local_75;
    }
    if (local_74 == false) {
      opndTmp._1_1_ = 0;
      bVar2 = IR::Opnd::IsTaggedInt(opndSrc2);
      if ((bVar2) && (bVar2 = IR::Opnd::IsTaggedInt(&pIStack_50->super_Opnd), bVar2)) {
        opndTmp._1_1_ = 1;
      }
      labelFallThru = IR::LabelInstr::New(Label,this->m_func,true);
      if ((opndTmp._1_1_ & 1) == 0) {
        GenerateSmIntPairTest(this,instr,opndSrc2,&pIStack_50->super_Opnd,labelFallThru);
      }
      bVar2 = IR::Opnd::IsAddrOpnd(opndSrc2);
      pOVar8 = opndSrc2;
      if (bVar2) {
        opndSrc2 = &pIStack_50->super_Opnd;
        pIStack_50 = (IntConstOpnd *)pOVar8;
      }
      opndSrc2 = IR::Opnd::UseWithNewType(opndSrc2,TyInt32,this->m_func);
      opndSrc1 = &IR::RegOpnd::New(TyInt32,this->m_func)->super_Opnd;
      labelHelper = (LabelInstr *)IR::Instr::New(MOV,opndSrc1,opndSrc2,this->m_func);
      IR::Instr::InsertBefore(instr,(Instr *)labelHelper);
      bVar2 = IR::Opnd::IsAddrOpnd(&pIStack_50->super_Opnd);
      pOVar8 = opndSrc1;
      if (bVar2) {
        pAVar7 = IR::Opnd::AsAddrOpnd(&pIStack_50->super_Opnd);
        iVar4 = Math::PointerCastToIntegralTruncate<int>(pAVar7->m_address);
        if (iVar4 == 1) {
          labelHelper = (LabelInstr *)IR::Instr::New(INC,opndSrc1,opndSrc1,this->m_func);
        }
        else {
          pIStack_50 = IR::IntConstOpnd::New((long)iVar4,TyInt32,this->m_func,false);
          labelHelper = (LabelInstr *)
                        IR::Instr::New(ADD,opndSrc1,opndSrc1,&pIStack_50->super_Opnd,this->m_func);
        }
      }
      else {
        src2Opnd = IR::Opnd::UseWithNewType(&pIStack_50->super_Opnd,TyInt32,this->m_func);
        labelHelper = (LabelInstr *)IR::Instr::New(ADD,pOVar8,pOVar8,src2Opnd,this->m_func);
      }
      IR::Instr::InsertBefore(instr,&labelHelper->super_Instr);
      Legalize<false>(&labelHelper->super_Instr,false);
      labelHelper = (LabelInstr *)IR::BranchInstr::New(JO,labelFallThru,this->m_func);
      IR::Instr::InsertBefore(instr,(Instr *)labelHelper);
      IVar3 = IR::Opnd::GetType(opndSrc1);
      if (IVar3 != TyInt64) {
        opndSrc1 = IR::Opnd::UseWithNewType(opndSrc1,TyUint64,this->m_func);
      }
      GenerateInt32ToVarConversion(this,opndSrc1,instr);
      pOVar8 = IR::Instr::GetDst(instr);
      labelHelper = (LabelInstr *)IR::Instr::New(MOV,pOVar8,opndSrc1,this->m_func);
      IR::Instr::InsertBefore(instr,(Instr *)labelHelper);
      opndReg = (Opnd *)IR::LabelInstr::New(Label,this->m_func,false);
      labelHelper = (LabelInstr *)IR::BranchInstr::New(JMP,(LabelInstr *)opndReg,this->m_func);
      IR::Instr::InsertBefore(instr,(Instr *)labelHelper);
      IR::Instr::InsertBefore(instr,&labelFallThru->super_Instr);
      IR::Instr::InsertAfter(instr,(Instr *)opndReg);
      this_local._7_1_ = true;
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool
LowererMD::GenerateFastAdd(IR::Instr * instrAdd)
{
    // Given:
    //
    // dst = Add src1, src2
    //
    // Generate:
    //
    // (If not 2 Int31's, jump to $helper.)
    // s1 = MOV src1
    // s1 = DEC s1          -- Get rid of one of the tag [Int31 only]
    // s1 = ADD s1, src2    -- try an inline add
    //      JO $helper      -- bail if the add overflowed
    // s1 = OR s1, AtomTag_IntPtr                        [Int32 only]
    // dst = MOV s1
    //      JMP $fallthru
    // $helper:
    //      (caller generates helper call)
    // $fallthru:

    IR::Instr *      instr;
    IR::LabelInstr * labelHelper;
    IR::LabelInstr * labelFallThru;
    IR::Opnd *       opndReg;
    IR::Opnd *       opndSrc1;
    IR::Opnd *       opndSrc2;

    opndSrc1 = instrAdd->GetSrc1();
    opndSrc2 = instrAdd->GetSrc2();
    AssertMsg(opndSrc1 && opndSrc2, "Expected 2 src opnd's on Add instruction");

    // Generate fastpath for Incr_A anyway -
    // Incrementing strings representing integers can be inter-mixed with integers e.g. "1"++ -> converts 1 to an int and thereafter, integer increment is expected.
    if (opndSrc1->IsRegOpnd() && (opndSrc1->AsRegOpnd()->IsNotInt() || opndSrc1->GetValueType().IsString()
        || (instrAdd->m_opcode != Js::OpCode::Incr_A && opndSrc1->GetValueType().IsLikelyString())))
    {
        return false;
    }

    if (opndSrc2->IsRegOpnd() && (opndSrc2->AsRegOpnd()->IsNotInt() ||
        opndSrc2->GetValueType().IsLikelyString()))
    {
        return false;
    }

    // Tagged ints?
    bool isTaggedInts = false;
    if (opndSrc1->IsTaggedInt())
    {
        if (opndSrc2->IsTaggedInt())
        {
            isTaggedInts = true;
        }
    }

    labelHelper = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);

    if (!isTaggedInts)
    {
        // (If not 2 Int31's, jump to $helper.)

        this->GenerateSmIntPairTest(instrAdd, opndSrc1, opndSrc2, labelHelper);
    }

    if (opndSrc1->IsAddrOpnd())
    {
        // If opnd1 is a constant, just swap them.
        IR::Opnd *opndTmp = opndSrc1;
        opndSrc1 = opndSrc2;
        opndSrc2 = opndTmp;
    }

    //
    // For 32 bit arithmetic we copy them and set the size of operands to be 32 bits. This is
    // relevant only on AMD64.
    //

    opndSrc1    = opndSrc1->UseWithNewType(TyInt32, this->m_func);

    // s1 = MOV src1

    opndReg = IR::RegOpnd::New(TyInt32, this->m_func);
    instr = IR::Instr::New(Js::OpCode::MOV, opndReg, opndSrc1, this->m_func);
    instrAdd->InsertBefore(instr);

#if !INT32VAR
    // Do the DEC in place
    if (opndSrc2->IsAddrOpnd())
    {
        Assert(opndSrc2->AsAddrOpnd()->GetAddrOpndKind() == IR::AddrOpndKindConstantVar);
        opndSrc2 = IR::IntConstOpnd::New(*((int *)&(opndSrc2->AsAddrOpnd()->m_address)) - 1, TyInt32, this->m_func, opndSrc2->AsAddrOpnd()->m_dontEncode);
        opndSrc2 = opndSrc2->Use(this->m_func);
    }
    else if (opndSrc2->IsIntConstOpnd())
    {
        Assert(opndSrc2->GetType() == TyInt32);
        opndSrc2 = opndSrc2->Use(this->m_func);
        opndSrc2->AsIntConstOpnd()->DecrValue(1);
    }
    else
    {
        // s1 = DEC s1
        opndSrc2 = opndSrc2->UseWithNewType(TyInt32, this->m_func);
        instr = IR::Instr::New(Js::OpCode::DEC, opndReg, opndReg, this->m_func);
        instrAdd->InsertBefore(instr);
    }

    instr = IR::Instr::New(Js::OpCode::ADD, opndReg, opndReg, opndSrc2, this->m_func);
#else
    if (opndSrc2->IsAddrOpnd())
    {
        // truncate to untag
        int value = ::Math::PointerCastToIntegralTruncate<int>(opndSrc2->AsAddrOpnd()->m_address);
        if (value == 1)
        {
            instr = IR::Instr::New(Js::OpCode::INC, opndReg, opndReg, this->m_func);
        }
        else
        {
            opndSrc2 = IR::IntConstOpnd::New(value, TyInt32, this->m_func);
            instr = IR::Instr::New(Js::OpCode::ADD, opndReg, opndReg, opndSrc2, this->m_func);
        }
    }
    else
    {
        instr = IR::Instr::New(Js::OpCode::ADD, opndReg, opndReg, opndSrc2->UseWithNewType(TyInt32, this->m_func), this->m_func);
    }
#endif

    // s1 = ADD s1, src2
    instrAdd->InsertBefore(instr);
    Legalize(instr);

    //      JO $helper

    instr = IR::BranchInstr::New(Js::OpCode::JO, labelHelper, this->m_func);
    instrAdd->InsertBefore(instr);

    //
    // Convert TyInt32 operand, back to TyMachPtr type.
    //

    if(TyMachReg != opndReg->GetType())
    {
        opndReg = opndReg->UseWithNewType(TyMachPtr, this->m_func);
    }

#if INT32VAR
    // s1 = OR s1, AtomTag_IntPtr
    GenerateInt32ToVarConversion(opndReg, instrAdd);
#endif

    // dst = MOV s1

    instr = IR::Instr::New(Js::OpCode::MOV, instrAdd->GetDst(), opndReg, this->m_func);
    instrAdd->InsertBefore(instr);

    //      JMP $fallthru

    labelFallThru = IR::LabelInstr::New(Js::OpCode::Label, this->m_func);
    instr = IR::BranchInstr::New(Js::OpCode::JMP, labelFallThru, this->m_func);
    instrAdd->InsertBefore(instr);

    // $helper:
    //      (caller generates helper call)
    // $fallthru:

    instrAdd->InsertBefore(labelHelper);
    instrAdd->InsertAfter(labelFallThru);

    return true;
}